

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlparser.cpp
# Opt level: O1

void UrlParserTest::http_url_with_port_invoker(void)

{
  undefined8 uVar1;
  ios_base *this;
  ostringstream local_238 [112];
  ios_base local_1c8 [264];
  undefined1 *local_c0;
  undefined8 local_b8;
  undefined1 local_b0;
  undefined7 uStack_af;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  string local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_98 = "";
  memset(local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_238);
  local_b8 = 0;
  local_b0 = 0;
  local_50 = (string)0x22;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"http_url_with_port",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_50);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a0,0x44);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  std::ios_base::~ios_base(local_1c8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_88 = "";
  memset(local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_238);
  local_b8 = 0;
  local_b0 = 0;
  local_50 = (string)0x22;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"http_url_with_port",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_50);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_90,0x44);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  std::ios_base::~ios_base(local_1c8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_78 = "";
  memset(local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_238);
  local_b8 = 0;
  local_b0 = 0;
  local_50 = (string)0x22;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"http_url_with_port",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_50);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_80,0x44);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  this = local_1c8;
  std::ios_base::~ios_base(this);
  http_url_with_port::test_method((http_url_with_port *)this);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_68 = "";
  memset(local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_238);
  local_b8 = 0;
  local_b0 = 0;
  local_50 = (string)0x22;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"http_url_with_port",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_50);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_70,0x44);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  std::ios_base::~ios_base(local_1c8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/nekipelov[P]httpparser/tests/urlparser.cpp";
  local_58 = "";
  memset(local_238,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_238);
  local_b8 = 0;
  local_b0 = 0;
  local_50 = (string)0x22;
  local_c0 = &local_b0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,(char *)&local_50,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"http_url_with_port",0x12)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c0,&local_50);
  if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
    operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
  }
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_60,0x44);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,CONCAT71(uStack_af,local_b0) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_238);
  std::ios_base::~ios_base(local_1c8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(http_url_with_port)
{
    const char *text = "http://www.example.com:8080/dir/subdir?param=1&param=2;param%20=%20#fragment";
    UrlParser parser(text);

    BOOST_CHECK_EQUAL(parser.isValid(), true);
    BOOST_CHECK_EQUAL(parser.scheme(), "http");
    BOOST_CHECK_EQUAL(parser.hostname(), "www.example.com");
    BOOST_CHECK_EQUAL(parser.path(), "/dir/subdir");
    BOOST_CHECK_EQUAL(parser.query(), "param=1&param=2;param%20=%20");
    BOOST_CHECK_EQUAL(parser.fragment(), "fragment");
    BOOST_CHECK_EQUAL(parser.httpPort(), 8080);
}